

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkRetimeBackwardInitialStart(Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  int i;
  
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pAVar1 = Abc_NtkObj(pNtk,i);
    if ((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 8)) {
      pAVar2 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
      (pAVar1->field_6).pCopy = pAVar2;
    }
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkRetimeBackwardInitialStart( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj;
    int i;
    // create the network used for the initial state computation
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    // create POs corresponding to the initial values
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsLatch(pObj) )
            pObj->pCopy = Abc_NtkCreatePo(pNtkNew);
    return pNtkNew;
}